

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

int32_t ulocimp_getScript_63(char *localeID,char *script,int32_t scriptCapacity,char **pEnd)

{
  byte c;
  UBool UVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  lVar4 = 0;
  while( true ) {
    c = localeID[lVar4];
    if (((c - 0x2d < 0x33) && ((0x4000000080003U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) ||
       (c == 0)) break;
    UVar1 = uprv_isASCIILetter_63(c);
    if (UVar1 == '\0') break;
    lVar4 = lVar4 + 1;
  }
  uVar3 = 0;
  if (lVar4 == 4) {
    if (pEnd != (char **)0x0) {
      *pEnd = localeID + 4;
    }
    uVar3 = 4;
    if (scriptCapacity < 4) {
      uVar3 = scriptCapacity;
    }
    if (0 < scriptCapacity) {
      cVar2 = uprv_toupper_63(*localeID);
      *script = cVar2;
      if (scriptCapacity != 1) {
        uVar5 = 1;
        do {
          cVar2 = uprv_asciitolower_63(localeID[uVar5]);
          script[uVar5] = cVar2;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
    }
  }
  return uVar3;
}

Assistant:

U_CFUNC int32_t
ulocimp_getScript(const char *localeID,
                  char *script, int32_t scriptCapacity,
                  const char **pEnd)
{
    int32_t idLen = 0;

    if (pEnd != NULL) {
        *pEnd = localeID;
    }

    /* copy the second item as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])
            && uprv_isASCIILetter(localeID[idLen])) {
        idLen++;
    }

    /* If it's exactly 4 characters long, then it's a script and not a country. */
    if (idLen == 4) {
        int32_t i;
        if (pEnd != NULL) {
            *pEnd = localeID+idLen;
        }
        if(idLen > scriptCapacity) {
            idLen = scriptCapacity;
        }
        if (idLen >= 1) {
            script[0]=(char)uprv_toupper(*(localeID++));
        }
        for (i = 1; i < idLen; i++) {
            script[i]=(char)uprv_tolower(*(localeID++));
        }
    }
    else {
        idLen = 0;
    }
    return idLen;
}